

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O1

void printLogicalImm64(MCInst *MI,uint OpNum,SStream *O)

{
  byte bVar1;
  cs_struct *h;
  cs_detail *pcVar2;
  bool bVar3;
  uint uVar4;
  MCOperand *op;
  ulong uVar5;
  uint8_t *puVar6;
  uint8_t uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  
  op = MCInst_getOperand(MI,OpNum);
  uVar5 = MCOperand_getImm(op);
  uVar11 = (uint)(uVar5 >> 6);
  uVar4 = (uint)uVar5 & 0x3f;
  uVar8 = uVar11 & 0x40 | uVar4;
  iVar10 = 0x20;
  if (uVar8 != 0x3f) {
    uVar8 = uVar8 ^ 0x3f;
    iVar9 = iVar10;
    do {
      iVar10 = iVar9 + -1;
      if (iVar9 == 2) break;
      bVar3 = 1 < uVar8;
      uVar8 = uVar8 >> 1;
      iVar9 = iVar10;
    } while (bVar3);
  }
  uVar8 = 0x80000000 >> ((byte)iVar10 & 0x1f);
  bVar1 = (byte)(uVar8 - 1);
  uVar5 = ~(-1L << (((byte)uVar4 & bVar1) + 1 & 0x3f));
  for (uVar11 = uVar11 & 0x3f & uVar8 - 1; uVar11 != 0; uVar11 = uVar11 - 1) {
    uVar5 = uVar5 >> 1 | (ulong)((uint)uVar5 & 1) << (bVar1 & 0x3f);
  }
  if (iVar10 != 0x19) {
    do {
      uVar5 = uVar5 | uVar5 << ((byte)uVar8 & 0x3f);
      uVar8 = uVar8 * 2;
    } while (uVar8 != 0x40);
  }
  uVar11 = MI->flat_insn->id;
  if ((int)uVar11 < 200) {
    if ((uVar11 == 0xe) || (uVar11 == 0x3f)) {
LAB_0021c918:
      if (uVar5 < 10) {
        SStream_concat(O,"#%u",uVar5 & 0xffffffff);
      }
      else {
        SStream_concat(O,"#0x%lx",uVar5);
      }
      goto LAB_0021c955;
    }
  }
  else if ((uVar11 == 200) || (uVar11 == 0x1b3)) goto LAB_0021c918;
  printInt64Bang(O,uVar5);
LAB_0021c955:
  h = MI->csh;
  if (h->detail != CS_OPT_OFF) {
    uVar11 = MCInst_getOpcode(MI);
    bVar1 = MI->ac_idx;
    puVar6 = AArch64_get_op_access(h,uVar11);
    uVar7 = '\0';
    if (puVar6[bVar1] != 0x80) {
      uVar7 = puVar6[bVar1];
    }
    pcVar2 = MI->flat_insn->detail;
    pcVar2->groups[(ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar7;
    MI->ac_idx = MI->ac_idx + '\x01';
    pcVar2 = MI->flat_insn->detail;
    puVar6 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x2d;
    puVar6[0] = '\x02';
    puVar6[1] = '\0';
    puVar6[2] = '\0';
    puVar6[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(ulong *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar5;
    puVar6 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar6 = *puVar6 + '\x01';
  }
  return;
}

Assistant:

static void printLogicalImm64(MCInst *MI, unsigned OpNum, SStream *O)
{
	int64_t Val = MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	Val = AArch64_AM_decodeLogicalImmediate(Val, 64);

	switch(MI->flat_insn->id) {
		default:
			printInt64Bang(O, Val);
			break;
		case ARM64_INS_ORR:
		case ARM64_INS_AND:
		case ARM64_INS_EOR:
		case ARM64_INS_TST:
			// do not print number in negative form
			if (Val >= 0 && Val <= HEX_THRESHOLD)
				SStream_concat(O, "#%u", (int)Val);
			else
				SStream_concat(O, "#0x%"PRIx64, Val);
			break;
	}

	if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
		uint8_t access;
		access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
		MI->ac_idx++;
#endif
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int64_t)Val;
		MI->flat_insn->detail->arm64.op_count++;
	}
}